

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# des.c
# Opt level: O2

LR des_inner_cipher(LR lr,des_keysched *sched,size_t start,size_t step)

{
  LR LVar1;
  
  LVar1 = des_round(lr,sched,start);
  LVar1 = des_round(LVar1,sched,step + start);
  LVar1 = des_round(LVar1,sched,start + step * 2);
  LVar1 = des_round(LVar1,sched,step * 3 + start);
  LVar1 = des_round(LVar1,sched,start + step * 4);
  LVar1 = des_round(LVar1,sched,step * 5 + start);
  LVar1 = des_round(LVar1,sched,step * 6 + start);
  LVar1 = des_round(LVar1,sched,step * 7 + start);
  LVar1 = des_round(LVar1,sched,start + step * 8);
  LVar1 = des_round(LVar1,sched,step * 9 + start);
  LVar1 = des_round(LVar1,sched,step * 10 + start);
  LVar1 = des_round(LVar1,sched,step * 0xb + start);
  LVar1 = des_round(LVar1,sched,step * 0xc + start);
  LVar1 = des_round(LVar1,sched,step * 0xd + start);
  LVar1 = des_round(LVar1,sched,step * 0xe + start);
  LVar1 = des_round(LVar1,sched,step * 0xf + start);
  return (LR)((long)LVar1 << 0x20 | (ulong)LVar1 >> 0x20);
}

Assistant:

static inline LR des_inner_cipher(LR lr, const des_keysched *sched,
                                  size_t start, size_t step)
{
    lr = des_round(lr, sched, start+0x0*step);
    lr = des_round(lr, sched, start+0x1*step);
    lr = des_round(lr, sched, start+0x2*step);
    lr = des_round(lr, sched, start+0x3*step);
    lr = des_round(lr, sched, start+0x4*step);
    lr = des_round(lr, sched, start+0x5*step);
    lr = des_round(lr, sched, start+0x6*step);
    lr = des_round(lr, sched, start+0x7*step);
    lr = des_round(lr, sched, start+0x8*step);
    lr = des_round(lr, sched, start+0x9*step);
    lr = des_round(lr, sched, start+0xa*step);
    lr = des_round(lr, sched, start+0xb*step);
    lr = des_round(lr, sched, start+0xc*step);
    lr = des_round(lr, sched, start+0xd*step);
    lr = des_round(lr, sched, start+0xe*step);
    lr = des_round(lr, sched, start+0xf*step);
    return des_swap_lr(lr);
}